

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  undefined4 uVar17;
  ulong uVar18;
  undefined1 uVar19;
  bool bVar20;
  ushort uVar21;
  uint uVar22;
  uint64_t uVar23;
  size_t sVar24;
  ulong uVar25;
  ctrl_t *pcVar26;
  anon_union_8_1_a8a14541_for_iterator_2 aVar27;
  bool bVar28;
  uint uVar29;
  PolicyFunctions *policy;
  ulong uVar30;
  ulong uVar31;
  CommonFields *common;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  FindInfo target;
  __m128i match;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_google::protobuf::Descriptor::WellKnownType_&>_>
  local_88;
  ulong local_78;
  ulong local_70;
  CommonFields *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [16];
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  uVar31 = key->_M_string_length;
  local_60 = key;
  uVar23 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,(key->_M_dataplus)._M_p,uVar31);
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar31 = (uVar23 ^ uVar31) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 | (uVar31 & 0xff0000000000) >> 0x18
            | (uVar31 & 0xff00000000) >> 8 | (uVar31 & 0xff000000) << 8 |
            (uVar31 & 0xff0000) << 0x18 | (uVar31 & 0xff00) << 0x28 | uVar31 << 0x38);
  uVar30 = *(ulong *)(this + 0x10);
  uVar25 = ((ulong)common >> 7 ^ uVar30 >> 0xc) & uVar2;
  uVar19 = (undefined1)(uVar31 >> 0x38);
  auVar32 = ZEXT216(CONCAT11(uVar19,uVar19) & 0x7f7f);
  auVar32 = pshuflw(auVar32,auVar32,0);
  local_58._0_4_ = auVar32._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  pcVar26 = (__return_storage_ptr__->first).ctrl_;
  aVar27 = (__return_storage_ptr__->first).field_1;
  bVar28 = __return_storage_ptr__->second;
  uVar31 = 0;
  do {
    pcVar1 = (char *)(uVar30 + uVar25);
    local_98 = *pcVar1;
    cStack_97 = pcVar1[1];
    cStack_96 = pcVar1[2];
    cStack_95 = pcVar1[3];
    uVar17 = *(undefined4 *)pcVar1;
    cVar5 = pcVar1[4];
    cVar6 = pcVar1[5];
    cVar7 = pcVar1[6];
    cVar8 = pcVar1[7];
    cVar9 = pcVar1[8];
    cVar10 = pcVar1[9];
    cVar11 = pcVar1[10];
    cVar12 = pcVar1[0xb];
    cVar13 = pcVar1[0xc];
    cVar14 = pcVar1[0xd];
    cVar15 = pcVar1[0xe];
    cVar16 = pcVar1[0xf];
    auVar32[0] = -(local_58[0] == local_98);
    auVar32[1] = -(local_58[1] == cStack_97);
    auVar32[2] = -(local_58[2] == cStack_96);
    auVar32[3] = -(local_58[3] == cStack_95);
    auVar32[4] = -(local_58[4] == cVar5);
    auVar32[5] = -(local_58[5] == cVar6);
    auVar32[6] = -(local_58[6] == cVar7);
    auVar32[7] = -(local_58[7] == cVar8);
    auVar32[8] = -(local_58[8] == cVar9);
    auVar32[9] = -(local_58[9] == cVar10);
    auVar32[10] = -(local_58[10] == cVar11);
    auVar32[0xb] = -(local_58[0xb] == cVar12);
    auVar32[0xc] = -(local_58[0xc] == cVar13);
    auVar32[0xd] = -(local_58[0xd] == cVar14);
    auVar32[0xe] = -(local_58[0xe] == cVar15);
    auVar32[0xf] = -(local_58[0xf] == cVar16);
    uVar21 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    policy = (PolicyFunctions *)(ulong)uVar21;
    uVar18 = uVar31;
    while (uVar21 != 0) {
      uVar22 = 0;
      uVar29 = (uint)policy;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar31 = uVar22 + uVar25 & uVar2;
      local_88.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + uVar31 * 0x28);
      local_88.second.super__Tuple_impl<0UL,_const_google::protobuf::Descriptor::WellKnownType_&>.
      super__Head_base<0UL,_const_google::protobuf::Descriptor::WellKnownType_&,_false>._M_head_impl
           = (_Tuple_impl<0UL,_const_google::protobuf::Descriptor::WellKnownType_&>)
             (*(long *)(this + 0x18) + 0x20 + uVar31 * 0x28);
      local_78 = uVar18;
      local_70 = uVar30;
      local_68 = common;
      local_40.rhs = local_60;
      local_40.eq = (key_equal *)this;
      bVar20 = memory_internal::
               DecomposePairImpl<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<google::protobuf::Descriptor::WellKnownType_const&>>
                         (&local_40,&local_88);
      if (bVar20) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar28;
        (__return_storage_ptr__->first).ctrl_ = pcVar26;
        if (*(long *)(this + 0x10) != 0) {
          lVar3 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar31);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar31 * 0x28 + lVar3);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_002402d6;
      }
      uVar21 = (ushort)(uVar29 - 1) & (ushort)policy;
      policy = (PolicyFunctions *)(ulong)CONCAT22((short)(uVar29 - 1 >> 0x10),uVar21);
      local_98 = (char)uVar17;
      cStack_97 = (char)((uint)uVar17 >> 8);
      cStack_96 = (char)((uint)uVar17 >> 0x10);
      cStack_95 = (char)((uint)uVar17 >> 0x18);
      uVar18 = local_78;
      uVar30 = local_70;
      common = local_68;
    }
    auVar33[0] = -(local_98 == -0x80);
    auVar33[1] = -(cStack_97 == -0x80);
    auVar33[2] = -(cStack_96 == -0x80);
    auVar33[3] = -(cStack_95 == -0x80);
    auVar33[4] = -(cVar5 == -0x80);
    auVar33[5] = -(cVar6 == -0x80);
    auVar33[6] = -(cVar7 == -0x80);
    auVar33[7] = -(cVar8 == -0x80);
    auVar33[8] = -(cVar9 == -0x80);
    auVar33[9] = -(cVar10 == -0x80);
    auVar33[10] = -(cVar11 == -0x80);
    auVar33[0xb] = -(cVar12 == -0x80);
    auVar33[0xc] = -(cVar13 == -0x80);
    auVar33[0xd] = -(cVar14 == -0x80);
    auVar33[0xe] = -(cVar15 == -0x80);
    auVar33[0xf] = -(cVar16 == -0x80);
    uVar21 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    if (uVar21 == 0) {
      uVar31 = uVar18 + 0x10;
      if (*(ulong *)this < uVar31) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar28;
        (__return_storage_ptr__->first).ctrl_ = pcVar26;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>, K = std::basic_string<char>]"
                     );
      }
      uVar25 = uVar25 + uVar18 + 0x10 & uVar2;
    }
    else {
      bVar20 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar20) {
        uVar4 = 0xf;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar22 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar22 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar18;
      sVar24 = PrepareInsertNonSoo((container_internal *)this,common,uVar22 + uVar25 & uVar2,target,
                                   policy);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar28;
        (__return_storage_ptr__->first).ctrl_ = pcVar26;
LAB_002402d6:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>]"
                     );
      }
      pcVar26 = (ctrl_t *)(*(long *)(this + 0x10) + sVar24);
      aVar27.slot_ = (slot_type *)(sVar24 * 0x28 + *(long *)(this + 0x18));
      bVar28 = true;
      uVar31 = uVar18;
    }
    if (uVar21 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar27;
      __return_storage_ptr__->second = bVar28;
      (__return_storage_ptr__->first).ctrl_ = pcVar26;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }